

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scanner.c
# Opt level: O3

void tree_sitter_c_sharp_external_scanner_deserialize(void *payload,char *buffer,uint length)

{
  byte bVar1;
  char cVar2;
  char cVar3;
  long lVar4;
  uint uVar5;
  void *pvVar6;
  uint uVar7;
  ulong uVar8;
  ulong uVar9;
  
  *(undefined1 *)payload = 0;
  *(undefined4 *)((long)payload + 0x10) = 0;
  if (length == 0) {
    uVar5 = 0;
  }
  else {
    *(char *)payload = *buffer;
    bVar1 = buffer[1];
    uVar7 = (uint)bVar1;
    *(uint *)((long)payload + 0x10) = (uint)bVar1;
    if (*(uint *)((long)payload + 0x14) < (uint)bVar1) {
      if (*(void **)((long)payload + 8) == (void *)0x0) {
        pvVar6 = malloc((ulong)((uint)bVar1 * 8));
        uVar7 = (uint)bVar1;
      }
      else {
        pvVar6 = realloc(*(void **)((long)payload + 8),(ulong)((uint)bVar1 * 8));
        uVar7 = *(uint *)((long)payload + 0x10);
      }
      *(void **)((long)payload + 8) = pvVar6;
      *(uint *)((long)payload + 0x14) = (uint)bVar1;
    }
    uVar5 = 2;
    if (uVar7 != 0) {
      uVar8 = 0;
      do {
        uVar9 = (ulong)uVar5;
        cVar2 = buffer[uVar5 + 1];
        uVar7 = uVar5 + 3;
        cVar3 = buffer[uVar5 + 2];
        uVar5 = uVar5 + 4;
        bVar1 = buffer[uVar7];
        lVar4 = *(long *)((long)payload + 8);
        *(char *)(lVar4 + uVar8 * 8) = buffer[uVar9];
        *(char *)(lVar4 + 1 + uVar8 * 8) = cVar2;
        *(char *)(lVar4 + 2 + uVar8 * 8) = cVar3;
        *(undefined1 *)(lVar4 + 3 + uVar8 * 8) = 0;
        *(uint *)(lVar4 + 4 + uVar8 * 8) = (uint)bVar1;
        uVar8 = uVar8 + 1;
      } while (uVar8 < *(uint *)((long)payload + 0x10));
    }
  }
  if (uVar5 == length) {
    return;
  }
  __assert_fail("size == length",
                "/workspace/llm4binary/github/license_c_cmakelists/tree-sitter[P]tree-sitter-c-sharp/src/scanner.c"
                ,0x6b,
                "void tree_sitter_c_sharp_external_scanner_deserialize(void *, const char *, unsigned int)"
               );
}

Assistant:

void tree_sitter_c_sharp_external_scanner_deserialize(void *payload, const char *buffer, unsigned length) {
    Scanner *scanner = (Scanner *)payload;

    scanner->quote_count = 0;
    array_clear(&scanner->interpolation_stack);
    unsigned size = 0;

    if (length > 0) {
        scanner->quote_count = (unsigned char)buffer[size++];
        scanner->interpolation_stack.size = (unsigned char)buffer[size++];
        array_reserve(&scanner->interpolation_stack, scanner->interpolation_stack.size);

        for (unsigned i = 0; i < scanner->interpolation_stack.size; i++) {
            Interpolation interpolation = {0};
            interpolation.dollar_count = buffer[size++];
            interpolation.open_brace_count = buffer[size++];
            interpolation.quote_count = buffer[size++];
            interpolation.string_type = (unsigned char)buffer[size++];
            scanner->interpolation_stack.contents[i] = interpolation;
        }
    }

    assert(size == length);
}